

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastUR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  SerialArena *this;
  __int_type_conflict2 _Var3;
  __pointer_type pSVar4;
  int iVar5;
  uint uVar6;
  Rep *pRVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  string *s;
  ushort *puVar9;
  char *pcVar10;
  Nonnull<const_char_*> failure_msg;
  uint uVar11;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  unsigned_long v2;
  ulong uVar12;
  uint *puVar13;
  TcParseTableBase *ptr_00;
  long in_FS_OFFSET;
  pair<const_char_*,_int> pVar14;
  LogMessageFatal local_40;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  bVar1 = *ptr;
  uVar6 = CONCAT31(0,bVar1);
  if (((long *)this_00[2].data != (long *)0x0) &&
     (data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80,
     *(long *)(in_FS_OFFSET + -0x78) == *(long *)this_00[2].data)) {
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar11 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar7 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar11 = pRVar7->allocated_size;
    }
    if (uVar11 == *(uint *)(this_00 + 1)) {
      do {
        bVar2 = *(byte *)((long)ptr + 1);
        ptr_00 = (TcParseTableBase *)(ulong)bVar2;
        uVar11 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          pVar14 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
          ctx_00 = pVar14._8_8_;
          if ((TcParseTableBase *)pVar14.first == (TcParseTableBase *)0x0) goto LAB_002088b7;
          uVar11 = pVar14.second;
          ptr_00 = (TcParseTableBase *)pVar14.first;
        }
        else {
          ptr_00 = (TcParseTableBase *)((long)ptr + 2);
        }
        _Var3 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var3 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(this);
        }
        else {
          uVar12 = _Var3 - 0x20;
          (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar12;
          pSVar4 = (this->string_block_)._M_b._M_p;
          v2 = (ulong)pSVar4->allocated_size_ - 0x10;
          if (v2 < uVar12) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (uVar12,v2,"offset <= effective_size()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                       ,0xa2,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
          }
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         ((long)&pSVar4[-1].next_ + _Var3);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar11,(string *)data.field_0
                        );
        ctx_00 = extraout_RDX;
        if ((ushort *)ptr == (ushort *)0x0) goto LAB_002088b7;
        pVVar8 = RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
        iVar5 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,pVVar8->_M_string_length);
        if (iVar5 == 0) goto LAB_002088a9;
        puVar9 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
        if (puVar9 <= ptr) goto LAB_00208871;
        data.field_0.data._4_4_ = 0;
        data.field_0.data._0_4_ = uVar6;
      } while ((byte)*(ushort *)ptr == bVar1);
      goto LAB_00208827;
    }
  }
  do {
    ptr_00 = (TcParseTableBase *)((long)ptr + 1);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_00;
    if ((ushort *)ptr == (ushort *)0x0) goto LAB_002088b7;
    pVVar8 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
    iVar5 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,pVVar8->_M_string_length);
    if (iVar5 == 0) goto LAB_002088a9;
    puVar9 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar9 <= ptr) goto LAB_00208871;
    data.field_0.data._4_4_ = 0;
    data.field_0.data._0_4_ = uVar6;
  } while ((byte)*(ushort *)ptr == bVar1);
LAB_00208827:
  if (ptr < puVar9) {
    uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar6 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar12 = (ulong)(uVar6 & 0xfffffff8);
    pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar12))
                                (msg,ptr,ctx,
                                 (ulong)*(ushort *)ptr ^
                                 *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2),table,hasbits);
    return pcVar10;
  }
LAB_00208871:
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_002088a9:
  ptr_00 = table;
  ReportFastUtf8Error(uVar6,table);
  ctx_00 = extraout_RDX_01;
LAB_002088b7:
  pcVar10 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<uint8_t,
                                          RepeatedPtrField<std::string>, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}